

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_precrqu_s_qb_ph_mipsel
          (target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict4 *env)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint16_t rtl;
  uint16_t rth;
  uint16_t rsl;
  uint16_t rsh;
  uint8_t tempA;
  uint8_t tempB;
  uint8_t tempC;
  uint8_t tempD;
  CPUMIPSState_conflict4 *env_local;
  target_ulong_conflict rt_local;
  target_ulong_conflict rs_local;
  
  bVar1 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x10),env);
  bVar2 = mipsdsp_sat8_reduce_precision((uint16_t)rs,env);
  bVar3 = mipsdsp_sat8_reduce_precision((uint16_t)(rt >> 0x10),env);
  bVar4 = mipsdsp_sat8_reduce_precision((uint16_t)rt,env);
  return (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4;
}

Assistant:

target_ulong helper_precrqu_s_qb_ph(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    uint8_t  tempD, tempC, tempB, tempA;
    uint16_t rsh, rsl, rth, rtl;

    rsh = (rs & MIPSDSP_HI) >> 16;
    rsl =  rs & MIPSDSP_LO;
    rth = (rt & MIPSDSP_HI) >> 16;
    rtl =  rt & MIPSDSP_LO;

    tempD = mipsdsp_sat8_reduce_precision(rsh, env);
    tempC = mipsdsp_sat8_reduce_precision(rsl, env);
    tempB = mipsdsp_sat8_reduce_precision(rth, env);
    tempA = mipsdsp_sat8_reduce_precision(rtl, env);

    return MIPSDSP_RETURN32_8(tempD, tempC, tempB, tempA);
}